

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUSet-inl.hh
# Opt level: O3

bool __thiscall
phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
insert(LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,size_t size)

{
  pointer pcVar1;
  bool bVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_false,_true>,_bool>
  pVar3;
  long *local_60 [2];
  long local_50 [2];
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_false,_true>,_bool>
  local_40;
  size_t local_30;
  
  pcVar1 = (key->_M_dataplus)._M_p;
  local_60[0] = local_50;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + key->_M_string_length);
  local_30 = size;
  pVar3 = ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::LRUSet<std::__cxx11::string>::Item>,std::allocator<std::pair<std::__cxx11::string_const,phosg::LRUSet<std::__cxx11::string>::Item>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string>,std::tuple<unsigned_long>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::LRUSet<std::__cxx11::string>::Item>,std::allocator<std::pair<std::__cxx11::string_const,phosg::LRUSet<std::__cxx11::string>::Item>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->items,&::std::piecewise_construct,(string *)local_60);
  local_40.first =
       pVar3.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
       ._M_cur;
  local_40.second = pVar3.second;
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  bVar2 = after_emplace(this,&local_40,size);
  return bVar2;
}

Assistant:

bool LRUSet<K>::insert(const K& key, size_t size) {
  auto emplace_ret = this->items.emplace(std::piecewise_construct,
      std::make_tuple(key), std::make_tuple(size));
  return this->after_emplace(emplace_ret, size);
}